

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  FILE *flv;
  FILE *flv_00;
  uint uVar2;
  int has_video;
  int has_audio;
  flvtag_t tag;
  char partyDudes [64];
  int local_90;
  int local_8c;
  flvtag_t local_88;
  char local_78 [72];
  
  flv = flv_open_read(argv[1]);
  flv_00 = flv_open_write(argv[2]);
  flvtag_init(&local_88);
  iVar1 = flv_read_header(flv,&local_8c,&local_90);
  if (iVar1 == 0) {
    main_cold_1();
    iVar1 = 1;
  }
  else {
    flv_write_header(flv_00,local_8c,local_90);
    iVar1 = flv_read_tag(flv,&local_88);
    if (iVar1 != 0) {
      uVar2 = 1000;
      do {
        if (((((*local_88.data & 0x1f) == 9) && ((local_88.data[0xb] & 0xf) == 7)) &&
            (local_88.data[0xc] == 1)) &&
           (uVar2 <= ((uint)local_88.data[6] |
                     (uint)local_88.data[5] << 8 |
                     (uint)local_88.data[4] << 0x10 | (uint)local_88.data[7] << 0x18))) {
          get_dudes(local_78);
          flvtag_addcaption_text(&local_88,local_78);
          fprintf(_stderr,"%d: %s\n",(ulong)uVar2,local_78);
          uVar2 = uVar2 + 500;
        }
        flv_write_tag(flv_00,&local_88);
        iVar1 = flv_read_tag(flv,&local_88);
      } while (iVar1 != 0);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    uint32_t nextParty = 1000;
    int has_audio, has_video;
    FILE* flv = flv_open_read(argv[1]);
    FILE* out = flv_open_write(argv[2]);
    char partyDudes[64];

    flvtag_init(&tag);

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    while (flv_read_tag(flv, &tag)) {

        if (flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag) && nextParty <= flvtag_timestamp(&tag)) {
            get_dudes(partyDudes);

            if (CAPTION_METHOD == CAPTION_METHOD_SEI_708) {
                flvtag_addcaption_text(&tag, partyDudes);
            } else if (CAPTION_METHOD == CAPTION_METHOD_AMF_708) {
                write_amfcaptions_708(out, nextParty, partyDudes);
            } else if (CAPTION_METHOD == CAPTION_METHOD_AMF_708) {
                write_amfcaptions_utf8(out, nextParty, partyDudes);
            } else {
                fprintf(stderr, "Unknnow method\n");
                return EXIT_FAILURE;
            }

            fprintf(stderr, "%d: %s\n", nextParty, partyDudes);
            nextParty += 500; // party all the time
        }

        flv_write_tag(out, &tag);
    }

    return EXIT_SUCCESS;
}